

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O1

void h2v2_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                  JSAMPARRAY *output_data_ptr)

{
  JSAMPROW pJVar1;
  JSAMPLE JVar2;
  uint uVar3;
  JSAMPARRAY input_array;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  if (0 < cinfo->max_v_samp_factor) {
    input_array = *output_data_ptr;
    lVar8 = 0;
    lVar7 = 0;
    do {
      uVar3 = cinfo->output_width;
      if ((ulong)uVar3 != 0) {
        pJVar4 = input_array[lVar7];
        pJVar5 = input_data[lVar8];
        lVar6 = 0;
        do {
          JVar2 = pJVar5[lVar6];
          pJVar1 = pJVar4 + lVar6 * 2;
          *pJVar1 = JVar2;
          pJVar1[1] = JVar2;
          lVar6 = lVar6 + 1;
        } while (pJVar1 + 2 < pJVar4 + uVar3);
      }
      jcopy_sample_rows(input_array,(uint)lVar7,input_array,(uint)lVar7 | 1,1,cinfo->output_width);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 2;
    } while ((int)lVar7 < cinfo->max_v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr, outptr;
  register JSAMPLE invalue;
  JSAMPROW outend;
  int inrow, outrow;

  inrow = outrow = 0;
  while (outrow < cinfo->max_v_samp_factor) {
    inptr = input_data[inrow];
    outptr = output_data[outrow];
    outend = outptr + cinfo->output_width;
    while (outptr < outend) {
      invalue = *inptr++;
      *outptr++ = invalue;
      *outptr++ = invalue;
    }
    jcopy_sample_rows(output_data, outrow, output_data, outrow + 1, 1,
                      cinfo->output_width);
    inrow++;
    outrow += 2;
  }
}